

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

void __thiscall rsg::BoolLiteral::tokenize(BoolLiteral *this,GeneratorState *state,TokenStream *str)

{
  Token local_20;
  
  VariableType::getScalarType(TYPE_BOOL);
  local_20.m_arg.boolValue =
       ((this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
        _M_impl.super__Vector_impl_data._M_start)->boolVal;
  local_20.m_type = BOOL_LITERAL;
  TokenStream::operator<<(str,&local_20);
  Token::~Token(&local_20);
  return;
}

Assistant:

void BoolLiteral::tokenize (GeneratorState& state, TokenStream& str) const
{
	DE_UNREF(state);
	str << Token(m_value.getValue(VariableType::getScalarType(VariableType::TYPE_BOOL)).asBool(0));
}